

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::clara::TextFlow::Column::iterator::calcLength(iterator *this)

{
  char cVar1;
  Column *pCVar2;
  ulong uVar3;
  pointer pbVar4;
  bool bVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  
  pCVar2 = this->m_column;
  uVar3 = this->m_stringIndex;
  pbVar4 = (pCVar2->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pCVar2->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) <= uVar3) {
    __assert_fail("m_stringIndex < m_column.m_strings.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/build_O1/tests/catch2/catch.hpp"
                  ,0x214e,"void Catch::clara::TextFlow::Column::iterator::calcLength()");
  }
  this->m_suffix = false;
  sVar10 = this->m_pos;
  sVar7 = 0xffffffffffffffff;
  if (sVar10 == 0 && uVar3 == 0) {
    sVar7 = pCVar2->m_initialIndent;
  }
  if (sVar7 == 0xffffffffffffffff) {
    sVar7 = pCVar2->m_indent;
  }
  sVar11 = pCVar2->m_width;
  this->m_end = sVar10;
  lVar6 = *(long *)&pbVar4[uVar3]._M_dataplus;
  if (*(char *)(lVar6 + sVar10) == '\n') {
    this->m_end = sVar10 + 1;
  }
  sVar11 = sVar11 - sVar7;
  uVar3 = *(size_type *)((long)(pbVar4 + uVar3) + 8);
  uVar8 = this->m_end;
  uVar9 = uVar8;
  if (uVar8 < uVar3) {
    do {
      uVar9 = uVar8;
      if (*(char *)(lVar6 + uVar8) == '\n') break;
      uVar8 = uVar8 + 1;
      this->m_end = uVar8;
      uVar9 = uVar3;
    } while (uVar3 != uVar8);
  }
  if (sVar11 + sVar10 <= uVar9) {
    sVar10 = sVar11;
    if (sVar11 != 0) {
      do {
        bVar5 = isBoundary(this,this->m_pos + sVar10);
        if (bVar5) goto joined_r0x001b695a;
        sVar10 = sVar10 - 1;
      } while (sVar10 != 0);
      sVar10 = 0;
    }
joined_r0x001b695a:
    do {
      if (sVar10 == 0) goto LAB_001b69aa;
      cVar1 = *(char *)((sVar10 - 1) +
                       *(long *)&(this->m_column->m_strings).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                                 _M_dataplus + this->m_pos);
      if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
        calcLength();
      }
      lVar6 = ::std::__cxx11::string::find(-0x18,(ulong)(uint)(int)cVar1);
      if (lVar6 == -1) goto LAB_001b69b4;
      sVar10 = sVar10 - 1;
    } while( true );
  }
  sVar10 = uVar9 - sVar10;
LAB_001b69b4:
  this->m_len = sVar10;
  return;
LAB_001b69aa:
  this->m_suffix = true;
  sVar10 = sVar11 - 1;
  goto LAB_001b69b4;
}

Assistant:

void calcLength() {
			assert(m_stringIndex < m_column.m_strings.size());

			m_suffix = false;
			auto width = m_column.m_width - indent();
			m_end = m_pos;
			if (line()[m_pos] == '\n') {
				++m_end;
			}
			while (m_end < line().size() && line()[m_end] != '\n')
				++m_end;

			if (m_end < m_pos + width) {
				m_len = m_end - m_pos;
			} else {
				size_t len = width;
				while (len > 0 && !isBoundary(m_pos + len))
					--len;
				while (len > 0 && isWhitespace(line()[m_pos + len - 1]))
					--len;

				if (len > 0) {
					m_len = len;
				} else {
					m_suffix = true;
					m_len = width - 1;
				}
			}
		}